

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_buffer_sizes.c
# Opt level: O1

int check_block_sizes_short(test_state *state)

{
  size_t sVar1;
  aec_stream *paVar2;
  ulong uVar3;
  int iVar4;
  uint uVar5;
  ulong uVar6;
  
  sVar1 = state->ibuf_len;
  uVar6 = 8;
  while( true ) {
    uVar5 = (uint)uVar6;
    if (0x40 < uVar5) {
      state->ibuf_len = sVar1;
      return 0;
    }
    paVar2 = state->strm;
    paVar2->block_size = uVar5;
    uVar3 = state->buf_len;
    paVar2->rsi = (uint)(uVar3 / (ulong)((long)(int)uVar5 * (long)state->bytes_per_sample));
    uVar6 = (ulong)(uVar5 * 2);
    state->ibuf_len = (uVar3 - uVar6) + 4;
    iVar4 = encode_decode_large(state);
    if (iVar4 != 0) break;
    if (state->strm->total_out != state->buf_len) {
      printf("FAIL: Unexpected buffer length. Got %i expected %i\n");
      return 99;
    }
  }
  return iVar4;
}

Assistant:

int check_block_sizes_short(struct test_state *state)
{
    int bs, status;
    size_t tmp;

    tmp = state->ibuf_len;
    for (bs = 8; bs <= 64; bs *= 2) {
        state->strm->block_size = bs;
        state->strm->rsi = (int)(state->buf_len
                                 / (bs * state->bytes_per_sample));
        state->ibuf_len = state->buf_len - 2 * bs + 4;
        status = encode_decode_large(state);
        if (status)
            return status;
        if (state->strm->total_out != state->buf_len) {
            printf("FAIL: Unexpected buffer length. Got %i expected %i\n",
                   (int)state->strm->total_out,
                   (int)state->buf_len);
            return 99;
        }
    }
    state->ibuf_len = tmp;
    return 0;
}